

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O2

void __thiscall fp::collector::collector(collector *this,string *name)

{
  time_point tVar1;
  time_point tVar2;
  ostream *poVar3;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostringstream os;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  tVar1 = boost::chrono::thread_clock::now();
  (this->m_thread_last).d_.rep_ = (rep)tVar1.d_.rep_;
  tVar2 = boost::chrono::steady_clock::now();
  (this->m_steady_last).d_.rep_ = (rep)tVar2.d_.rep_;
  this->m_count = 0;
  (this->m_thread_accumulator).rep_ = 0;
  (this->m_steady_accumulator).rep_ = 0;
  tVar2 = boost::chrono::steady_clock::now();
  (this->m_last_report).d_.rep_ = (rep)tVar2.d_.rep_;
  (this->m_fmt)._M_dataplus._M_p = (pointer)&(this->m_fmt).field_2;
  (this->m_fmt)._M_string_length = 0;
  (this->m_fmt).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"[FP] ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  __id._M_thread = pthread_self();
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__id);
  poVar3 = std::operator<<((ostream *)pbVar4," ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::operator<<(poVar3," #%-7lu %8.5F %8.5F %11.4F %11.4F\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_fmt,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

collector(const std::string &name)
    : m_thread_last{thread_clock::now()},
      m_steady_last{steady_clock::now()},
      m_count{0},
      m_thread_accumulator{0},
      m_steady_accumulator{0},
      m_last_report{steady_clock::now()}
  {
    std::ostringstream os;
    os << "[FP] " << std::hex << std::this_thread::get_id() << " " << name << " #%-7lu %8.5F %8.5F %11.4F %11.4F\n";
    m_fmt = os.str();
  }